

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

void __thiscall qe::Context::textcontext(Context *this)

{
  if (this->context != TEXT) {
    (*glad_glDisable)(0xb71);
    (*glad_glDisable)(0xb44);
    (*glad_glEnable)(0xbe2);
    this->context = TEXT;
    _logger_e = (*glad_glGetError)();
    if (_logger_e != 0) {
      throw_glerror(_logger_e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/context.hpp"
                    ,0x111);
      return;
    }
  }
  return;
}

Assistant:

void textcontext() {
            if(context == TEXT)
                return;

            glDisable(GL_DEPTH_TEST);
            glDisable(GL_CULL_FACE);
            glEnable(GL_BLEND);
            context = TEXT;
            GLERRORCHECK;
        }